

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement_const,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement_const,&kj::(anonymous_namespace)::TestElement::link>>&>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_const_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_const_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
          *params)

{
  undefined4 in_register_0000000c;
  String argValues [1];
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  Array<char> local_48;
  
  this->exception = (Exception *)0x0;
  local_58 = "(can\'t stringify)";
  local_50 = 0x12;
  local_68.content.ptr = "(can\'t stringify)";
  local_68.content.size_ = 0x12;
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            ((String *)&local_48,(_ *)&local_58,
             (StringPtr *)(CONCAT44(in_register_0000000c,code) + 0x18),&local_68,
             (StringPtr *)condition);
  argValues[0].content.ptr = local_48.ptr;
  argValues[0].content.size_ = local_48.size_;
  argValues[0].content.disposer = local_48.disposer;
  local_48.ptr = (char *)0x0;
  local_48.size_ = 0;
  Array<char>::~Array(&local_48);
  init(this,(EVP_PKEY_CTX *)
            "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
      );
  Array<char>::~Array(&argValues[0].content);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}